

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qtransform.cpp
# Opt level: O1

bool QTransform::squareToQuad(QPolygonF *quad,QTransform *trans)

{
  ulong uVar1;
  QPointF *pQVar2;
  double dVar3;
  double dVar4;
  double dVar5;
  double dVar6;
  double dVar7;
  double dVar8;
  bool bVar9;
  ulong uVar10;
  qreal qVar11;
  qreal qVar12;
  undefined1 auVar13 [16];
  undefined1 auVar14 [16];
  double dVar15;
  double dVar16;
  double dVar17;
  double dVar18;
  double dVar19;
  
  uVar1 = (quad->super_QList<QPointF>).d.size;
  if (uVar1 == 0) {
    uVar10 = 4;
  }
  else {
    pQVar2 = (quad->super_QList<QPointF>).d.ptr;
    bVar9 = qFuzzyCompare(pQVar2,pQVar2 + (uVar1 - 1));
    uVar10 = (ulong)bVar9 | 4;
  }
  if (uVar1 == uVar10) {
    pQVar2 = (quad->super_QList<QPointF>).d.ptr;
    dVar3 = pQVar2->xp;
    dVar4 = pQVar2->yp;
    dVar5 = pQVar2[1].xp;
    dVar6 = pQVar2[1].yp;
    dVar17 = pQVar2[2].xp;
    dVar19 = pQVar2[2].yp;
    dVar7 = pQVar2[3].xp;
    dVar8 = pQVar2[3].yp;
    dVar15 = ((dVar3 - dVar5) + dVar17) - dVar7;
    dVar16 = ((dVar4 - dVar6) + dVar19) - dVar8;
    if ((((dVar15 != 0.0) || (NAN(dVar15))) || (dVar16 != 0.0)) || (NAN(dVar16))) {
      dVar18 = (dVar8 - dVar19) * (dVar5 - dVar17) - (dVar6 - dVar19) * (dVar7 - dVar17);
      if ((dVar18 == 0.0) && (!NAN(dVar18))) goto LAB_004408af;
      auVar13._0_8_ = (dVar8 - dVar19) * dVar15 + -(dVar7 - dVar17) * dVar16;
      auVar13._8_8_ = (dVar5 - dVar17) * dVar16 + -dVar15 * (dVar6 - dVar19);
      auVar14._8_8_ = dVar18;
      auVar14._0_8_ = dVar18;
      auVar14 = divpd(auVar13,auVar14);
      qVar11 = (dVar5 - dVar3) + auVar14._0_8_ * dVar5;
      qVar12 = (dVar6 - dVar4) + auVar14._0_8_ * dVar6;
      dVar17 = (dVar7 - dVar3) + auVar14._8_8_ * dVar7;
      dVar19 = (dVar8 - dVar4) + auVar14._8_8_ * dVar8;
    }
    else {
      dVar17 = dVar17 - dVar5;
      dVar19 = dVar19 - dVar6;
      qVar11 = dVar5 - dVar3;
      qVar12 = dVar6 - dVar4;
      auVar14 = ZEXT816(0);
    }
    trans->m_matrix[0][0] = qVar11;
    trans->m_matrix[0][1] = qVar12;
    trans->m_matrix[0][2] = auVar14._0_8_;
    trans->m_matrix[1][0] = dVar17;
    trans->m_matrix[1][1] = dVar19;
    trans->m_matrix[1][2] = auVar14._8_8_;
    trans->m_matrix[2][0] = dVar3;
    trans->m_matrix[2][1] = dVar4;
    trans->m_matrix[2][2] = 1.0;
    *(ushort *)&trans->field_0x48 = (ushort)*(undefined4 *)&trans->field_0x48 & 0xfc00 | 0x200;
    bVar9 = true;
  }
  else {
LAB_004408af:
    bVar9 = false;
  }
  return bVar9;
}

Assistant:

bool QTransform::squareToQuad(const QPolygonF &quad, QTransform &trans)
{
    if (quad.size() != (quad.isClosed() ? 5 : 4))
        return false;

    qreal dx0 = quad[0].x();
    qreal dx1 = quad[1].x();
    qreal dx2 = quad[2].x();
    qreal dx3 = quad[3].x();

    qreal dy0 = quad[0].y();
    qreal dy1 = quad[1].y();
    qreal dy2 = quad[2].y();
    qreal dy3 = quad[3].y();

    double ax  = dx0 - dx1 + dx2 - dx3;
    double ay  = dy0 - dy1 + dy2 - dy3;

    if (!ax && !ay) { //afine transform
        trans.setMatrix(dx1 - dx0, dy1 - dy0,  0,
                        dx2 - dx1, dy2 - dy1,  0,
                        dx0,       dy0,  1);
    } else {
        double ax1 = dx1 - dx2;
        double ax2 = dx3 - dx2;
        double ay1 = dy1 - dy2;
        double ay2 = dy3 - dy2;

        /*determinants */
        double gtop    =  ax  * ay2 - ax2 * ay;
        double htop    =  ax1 * ay  - ax  * ay1;
        double bottom  =  ax1 * ay2 - ax2 * ay1;

        double a, b, c, d, e, f, g, h;  /*i is always 1*/

        if (!bottom)
            return false;

        g = gtop/bottom;
        h = htop/bottom;

        a = dx1 - dx0 + g * dx1;
        b = dx3 - dx0 + h * dx3;
        c = dx0;
        d = dy1 - dy0 + g * dy1;
        e = dy3 - dy0 + h * dy3;
        f = dy0;

        trans.setMatrix(a, d, g,
                        b, e, h,
                        c, f, 1.0);
    }

    return true;
}